

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall
Fl_Text_Display::update_line_starts
          (Fl_Text_Display *this,int pos,int charsInserted,int charsDeleted,int linesInserted,
          int linesDeleted,int *scrolled)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint endLine;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int lineOfPos;
  int local_38;
  int local_34;
  
  piVar3 = this->mLineStarts;
  endLine = this->mNVisibleLines;
  lVar10 = (long)(int)endLine;
  iVar8 = charsInserted - charsDeleted;
  uVar11 = linesInserted - linesDeleted;
  if (charsDeleted + pos < this->mFirstChar) {
    this->mTopLineNum = this->mTopLineNum + uVar11;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)endLine) {
      uVar7 = (ulong)endLine;
    }
    for (; (uVar7 != uVar5 && (piVar3[uVar5] != -1)); uVar5 = uVar5 + 1) {
      piVar3[uVar5] = piVar3[uVar5] + iVar8;
    }
    uVar1 = this->mFirstChar;
    uVar2 = this->mLastChar;
    this->mFirstChar = iVar8 + uVar1;
    this->mLastChar = iVar8 + uVar2;
    iVar9 = 0;
    goto LAB_001cfcf0;
  }
  if (this->mFirstChar <= pos) {
    if (this->mLastChar < pos) {
      iVar9 = 0;
      if ((0 < (int)endLine) && (piVar3[lVar10 + -1] == -1)) {
        position_to_line(this,pos,&lineOfPos);
        calc_line_starts(this,lineOfPos,linesInserted + lineOfPos);
        calc_last_char(this);
      }
    }
    else {
      local_38 = linesInserted;
      position_to_line(this,pos,&lineOfPos);
      if (local_38 == linesDeleted) {
        lVar6 = (long)lineOfPos;
        while ((lVar6 = lVar6 + 1, lVar6 < lVar10 && (piVar3[lVar6] != -1))) {
          piVar3[lVar6] = piVar3[lVar6] + iVar8;
        }
      }
      else if ((int)uVar11 < 1) {
        iVar9 = -1;
        if (-1 < lineOfPos) {
          iVar9 = lineOfPos;
        }
        lVar10 = (long)iVar9;
        while (lVar10 = lVar10 + 1, lVar10 < (int)(endLine + uVar11)) {
          iVar9 = iVar8;
          if (piVar3[lVar10 - (int)uVar11] == -1) {
            iVar9 = 0;
          }
          piVar3[lVar10] = iVar9 + piVar3[lVar10 - (int)uVar11];
        }
      }
      else {
        for (; (int)(uVar11 + lineOfPos + 1) < lVar10; lVar10 = lVar10 + -1) {
          iVar9 = iVar8;
          if (piVar3[(lVar10 + -1) - (ulong)uVar11] == -1) {
            iVar9 = 0;
          }
          piVar3[lVar10 + -1] = iVar9 + piVar3[(lVar10 + -1) - (ulong)uVar11];
        }
      }
      if (-1 < local_38) {
        calc_line_starts(this,lineOfPos + 1,local_38 + lineOfPos);
      }
      if ((int)uVar11 < 0) {
        calc_line_starts(this,uVar11 + endLine,endLine);
      }
      calc_last_char(this);
      iVar9 = 0;
    }
    goto LAB_001cfcf0;
  }
  iVar4 = position_to_line(this,charsDeleted + pos,&local_34);
  iVar9 = 1;
  if (iVar4 == 0) {
LAB_001cfb94:
    if ((int)(uVar11 + this->mNBufferLines) < this->mTopLineNum) {
      this->mTopLineNum = 1;
      iVar8 = 0;
    }
    else {
      iVar8 = skip_lines(this,0,this->mTopLineNum + -1,true);
    }
  }
  else {
    if (((int)endLine <= local_34 + 1) || (piVar3[(long)local_34 + 1] == -1)) goto LAB_001cfb94;
    iVar4 = uVar11 + this->mTopLineNum;
    if (iVar4 < 2) {
      iVar4 = iVar9;
    }
    this->mTopLineNum = iVar4;
    iVar8 = rewind_lines(this,iVar8 + piVar3[(long)local_34 + 1],local_34 + 1);
  }
  this->mFirstChar = iVar8;
  calc_line_starts(this,0,endLine - 1);
  calc_last_char(this);
LAB_001cfcf0:
  *scrolled = iVar9;
  return;
}

Assistant:

void Fl_Text_Display::update_line_starts(int pos, int charsInserted,
                                         int charsDeleted, int linesInserted,
                                         int linesDeleted, int *scrolled ) {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int *lineStarts = mLineStarts;
  int i, lineOfPos, lineOfEnd, nVisLines = mNVisibleLines;
  int charDelta = charsInserted - charsDeleted;
  int lineDelta = linesInserted - linesDeleted;

  /* If all of the changes were before the displayed text, the display
   doesn't change, just update the top line num and offset the line
   start entries and first and last characters */
  if ( pos + charsDeleted < mFirstChar ) {
    mTopLineNum += lineDelta;
    for ( i = 0; i < nVisLines && lineStarts[i] != -1; i++ )
      lineStarts[ i ] += charDelta;
    mFirstChar += charDelta;
    mLastChar += charDelta;
    *scrolled = 0;
    return;
  }

  /* The change began before the beginning of the displayed text, but
   part or all of the displayed text was deleted */
  if ( pos < mFirstChar ) {
    /* If some text remains in the window, anchor on that  */
    if ( position_to_line( pos + charsDeleted, &lineOfEnd ) &&
        ++lineOfEnd < nVisLines && lineStarts[ lineOfEnd ] != -1 ) {
      mTopLineNum = max( 1, mTopLineNum + lineDelta );
      mFirstChar = rewind_lines(lineStarts[ lineOfEnd ] + charDelta, lineOfEnd );
      /* Otherwise anchor on original line number and recount everything */
    } else {
      if ( mTopLineNum > mNBufferLines + lineDelta ) {
        mTopLineNum = 1;
        mFirstChar = 0;
      } else
        mFirstChar = skip_lines( 0, mTopLineNum - 1, true );
    }
    calc_line_starts( 0, nVisLines - 1 );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 1;
    return;
  }

  /* If the change was in the middle of the displayed text (it usually is),
   salvage as much of the line starts array as possible by moving and
   offsetting the entries after the changed area, and re-counting the
   added lines or the lines beyond the salvaged part of the line starts
   array */
  if ( pos <= mLastChar ) {
    /* find line on which the change began */
    position_to_line( pos, &lineOfPos );
    /* salvage line starts after the changed area */
    if ( lineDelta == 0 ) {
      for ( i = lineOfPos + 1; i < nVisLines && lineStarts[ i ] != -1; i++ )
        lineStarts[ i ] += charDelta;
    } else if ( lineDelta > 0 ) {
      for ( i = nVisLines - 1; i >= lineOfPos + lineDelta + 1; i-- )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    } else /* (lineDelta < 0) */ {
      for ( i = max( 0, lineOfPos + 1 ); i < nVisLines + lineDelta; i++ )
        lineStarts[ i ] = lineStarts[ i - lineDelta ] +
        ( lineStarts[ i - lineDelta ] == -1 ? 0 : charDelta );
    }
    /* fill in the missing line starts */
    if ( linesInserted >= 0 )
      calc_line_starts( lineOfPos + 1, lineOfPos + linesInserted );
    if ( lineDelta < 0 )
      calc_line_starts( nVisLines + lineDelta, nVisLines );
    /* calculate lastChar by finding the end of the last displayed line */
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was past the end of the displayed text, but displayable by virtue
   of being an insert at the end of the buffer into visible blank lines */
  if ( empty_vlines() ) {
    position_to_line( pos, &lineOfPos );
    calc_line_starts( lineOfPos, lineOfPos + linesInserted );
    calc_last_char();
    *scrolled = 0;
    return;
  }

  /* Change was beyond the end of the buffer and not visible, do nothing */
  *scrolled = 0;
}